

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool rw::findChunk(Stream *s,uint32 type,uint32 *length,uint32 *version)

{
  bool bVar1;
  undefined1 local_40 [8];
  ChunkHeaderInfo header;
  uint32 *version_local;
  uint32 *length_local;
  uint32 type_local;
  Stream *s_local;
  
  header._8_8_ = version;
  while( true ) {
    bVar1 = readChunkHeaderInfo(s,(ChunkHeaderInfo *)local_40);
    if (!bVar1) {
      return false;
    }
    if (local_40._0_4_ == 0) break;
    if (local_40._0_4_ == type) {
      if (length != (uint32 *)0x0) {
        *length = local_40._4_4_;
      }
      if (header._8_8_ != 0) {
        *(uint32 *)header._8_8_ = header.type;
      }
      return true;
    }
    (*s->_vptr_Stream[5])(s,(ulong)(uint)local_40._4_4_,1);
  }
  return false;
}

Assistant:

bool
findChunk(Stream *s, uint32 type, uint32 *length, uint32 *version)
{
	ChunkHeaderInfo header;
	while(readChunkHeaderInfo(s, &header)){
		if(header.type == ID_NAOBJECT)
			return false;
		if(header.type == type){
			if(length)
				*length = header.length;
			if(version)
				*version = header.version;
			return true;
		}
		s->seek(header.length);
	}
	return false;
}